

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cffparse.c
# Opt level: O3

FT_Error cff_parse_private_dict(CFF_Parser parser)

{
  FT_Byte **ppFVar1;
  void *pvVar2;
  FT_Long FVar3;
  FT_Error FVar4;
  
  ppFVar1 = parser->stack;
  FVar4 = 0xa1;
  if (ppFVar1 + 2 <= parser->top) {
    pvVar2 = parser->object;
    FVar3 = cff_parse_num(parser,(FT_Byte **)*ppFVar1);
    FVar4 = 3;
    if (-1 < FVar3) {
      *(FT_Long *)((long)pvVar2 + 0xd0) = FVar3;
      FVar3 = cff_parse_num(parser,(FT_Byte **)ppFVar1[1]);
      if (-1 < FVar3) {
        *(FT_Long *)((long)pvVar2 + 200) = FVar3;
        FVar4 = 0;
      }
    }
  }
  return FVar4;
}

Assistant:

static FT_Error
  cff_parse_private_dict( CFF_Parser  parser )
  {
    CFF_FontRecDict  dict = (CFF_FontRecDict)parser->object;
    FT_Byte**        data = parser->stack;
    FT_Error         error;


    error = FT_ERR( Stack_Underflow );

    if ( parser->top >= parser->stack + 2 )
    {
      FT_Long  tmp;


      tmp = cff_parse_num( parser, data++ );
      if ( tmp < 0 )
      {
        FT_ERROR(( "cff_parse_private_dict: Invalid dictionary size\n" ));
        error = FT_THROW( Invalid_File_Format );
        goto Fail;
      }
      dict->private_size = (FT_ULong)tmp;

      tmp = cff_parse_num( parser, data );
      if ( tmp < 0 )
      {
        FT_ERROR(( "cff_parse_private_dict: Invalid dictionary offset\n" ));
        error = FT_THROW( Invalid_File_Format );
        goto Fail;
      }
      dict->private_offset = (FT_ULong)tmp;

      FT_TRACE4(( " %lu %lu\n",
                  dict->private_size, dict->private_offset ));

      error = FT_Err_Ok;
    }

  Fail:
    return error;
  }